

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<QToolBarAreaLayoutItem>::emplace<QToolBarAreaLayoutItem_const&>
          (QPodArrayOps<QToolBarAreaLayoutItem> *this,qsizetype i,QToolBarAreaLayoutItem *args)

{
  long lVar1;
  undefined8 uVar2;
  QLayoutItem *pQVar3;
  undefined8 uVar4;
  bool bVar5;
  qsizetype qVar6;
  QToolBarAreaLayoutItem *pQVar7;
  undefined8 *in_RDX;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_RSI;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_RDI;
  long in_FS_OFFSET;
  QToolBarAreaLayoutItem *where;
  GrowthPosition pos;
  bool detach;
  QToolBarAreaLayoutItem tmp;
  QArrayDataPointer<QToolBarAreaLayoutItem> *in_stack_ffffffffffffffb8;
  undefined4 uVar8;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 uVar9;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = QArrayDataPointer<QToolBarAreaLayoutItem>::needsDetach(in_RDI);
  uVar9 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffffc4);
  if (!bVar5) {
    if ((in_RSI == (QArrayDataPointer<QToolBarAreaLayoutItem> *)in_RDI->size) &&
       (qVar6 = QArrayDataPointer<QToolBarAreaLayoutItem>::freeSpaceAtEnd(in_stack_ffffffffffffffb8)
       , qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QToolBarAreaLayoutItem>::end(in_RDI);
      pQVar7->widgetItem = (QLayoutItem *)*in_RDX;
      uVar2 = in_RDX[1];
      pQVar7->pos = (int)uVar2;
      pQVar7->size = (int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar7->preferredSize = (int)uVar2;
      pQVar7->gap = (bool)(char)((ulong)uVar2 >> 0x20);
      *(int3 *)&pQVar7->field_0x15 = (int3)((ulong)uVar2 >> 0x28);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_006fb546;
    }
    if ((in_RSI == (QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0) &&
       (qVar6 = QArrayDataPointer<QToolBarAreaLayoutItem>::freeSpaceAtBegin
                          (in_stack_ffffffffffffffb8), qVar6 != 0)) {
      pQVar7 = QArrayDataPointer<QToolBarAreaLayoutItem>::begin
                         ((QArrayDataPointer<QToolBarAreaLayoutItem> *)0x6fb445);
      pQVar7[-1].widgetItem = (QLayoutItem *)*in_RDX;
      uVar2 = in_RDX[1];
      pQVar7[-1].pos = (int)uVar2;
      pQVar7[-1].size = (int)((ulong)uVar2 >> 0x20);
      uVar2 = in_RDX[2];
      pQVar7[-1].preferredSize = (int)uVar2;
      pQVar7[-1].gap = (bool)(char)((ulong)uVar2 >> 0x20);
      *(int3 *)&pQVar7[-1].field_0x15 = (int3)((ulong)uVar2 >> 0x28);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_006fb546;
    }
  }
  pQVar3 = (QLayoutItem *)*in_RDX;
  uVar2 = in_RDX[1];
  uVar4 = in_RDX[2];
  uVar8 = 0;
  if ((in_RDI->size != 0) && (in_RSI == (QArrayDataPointer<QToolBarAreaLayoutItem> *)0x0)) {
    uVar8 = 1;
  }
  QArrayDataPointer<QToolBarAreaLayoutItem>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar9,uVar8),
             (QToolBarAreaLayoutItem **)in_stack_ffffffffffffffb8,in_RDI);
  pQVar7 = createHole((QPodArrayOps<QToolBarAreaLayoutItem> *)in_RSI,
                      (GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(uVar9,uVar8),
                      (qsizetype)in_stack_ffffffffffffffb8);
  pQVar7->widgetItem = pQVar3;
  pQVar7->pos = (int)uVar2;
  pQVar7->size = (int)((ulong)uVar2 >> 0x20);
  pQVar7->preferredSize = (int)uVar4;
  pQVar7->gap = (bool)(char)((ulong)uVar4 >> 0x20);
  *(int3 *)&pQVar7->field_0x15 = (int3)((ulong)uVar4 >> 0x28);
LAB_006fb546:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }